

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O3

longlong yajl_parse_integer(uchar *number,uint length)

{
  uchar uVar1;
  byte *pbVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  
  uVar1 = *number;
  pbVar2 = number + (ulong)(number[uVar1 == '-'] == '+') + (ulong)(uVar1 == '-');
  if (pbVar2 < number + length) {
    lVar5 = 0;
    do {
      if (0xcccccccccccccd3 < lVar5) {
LAB_00103891:
        piVar3 = __errno_location();
        *piVar3 = 0x22;
        if (uVar1 == '-') {
          return -0x8000000000000000;
        }
        return 0x7fffffffffffffff;
      }
      lVar4 = (ulong)*pbVar2 - 0x30;
      if ((lVar5 * -10 + 0x7fffffffffffffff < lVar4) || ((byte)(*pbVar2 - 0x3a) < 0xf6))
      goto LAB_00103891;
      pbVar2 = pbVar2 + 1;
      lVar5 = lVar4 + lVar5 * 10;
    } while (pbVar2 < number + length);
  }
  else {
    lVar5 = 0;
  }
  lVar4 = -lVar5;
  if (uVar1 != '-') {
    lVar4 = lVar5;
  }
  return lVar4;
}

Assistant:

long long
yajl_parse_integer(const unsigned char *number, unsigned int length)
{
    long long ret  = 0;
    long sign = 1;
    const unsigned char *pos = number;
    if (*pos == '-') { pos++; sign = -1; }
    if (*pos == '+') { pos++; }

    while (pos < number + length) {
        if ( ret > MAX_VALUE_TO_MULTIPLY ) {
            errno = ERANGE;
            return sign == 1 ? LLONG_MAX : LLONG_MIN;
        }
        ret *= 10;
        if (LLONG_MAX - ret < (*pos - '0')) {
            errno = ERANGE;
            return sign == 1 ? LLONG_MAX : LLONG_MIN;
        }
        if (*pos < '0' || *pos > '9') {
            errno = ERANGE;
            return sign == 1 ? LLONG_MAX : LLONG_MIN;
        }
        ret += (*pos++ - '0');
    }

    return sign * ret;
}